

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# posix_code.hpp
# Opt level: O0

string_ref *
system_error2::_posix_code_domain::_make_string_ref(string_ref *__return_storage_ptr__,int c)

{
  string_ref local_460;
  char *local_430;
  char *p;
  size_t length;
  char *s;
  char buffer [1024];
  int c_local;
  
  buffer._1020_4_ = c;
  memset(&s,0,0x400);
  length = (size_t)strerror_r(buffer._1020_4_,(char *)&s,0x400);
  if ((char *)length != (char *)0x0) {
    strncpy((char *)&s,(char *)length,0x3ff);
    buffer[0x3f7] = '\0';
  }
  p = (char *)strlen((char *)&s);
  local_430 = (char *)malloc((size_t)(p + 1));
  if (local_430 == (char *)0x0) {
    status_code_domain::string_ref::string_ref
              (__return_storage_ptr__,"failed to get message from system",0xffffffffffffffff,
               (void *)0x0,(void *)0x0,(void *)0x0,
               status_code_domain::string_ref::_checking_string_thunk);
  }
  else {
    memcpy(local_430,&s,(size_t)(p + 1));
    status_code_domain::atomic_refcounted_string_ref::atomic_refcounted_string_ref
              ((atomic_refcounted_string_ref *)&local_460,local_430,(size_type)p,(void *)0x0,
               (void *)0x0);
    status_code_domain::string_ref::string_ref(__return_storage_ptr__,&local_460);
    status_code_domain::atomic_refcounted_string_ref::~atomic_refcounted_string_ref
              ((atomic_refcounted_string_ref *)&local_460);
  }
  return __return_storage_ptr__;
}

Assistant:

static _base::string_ref _make_string_ref(int c) noexcept
  {
    char buffer[1024] = "";
#ifdef _WIN32
    strerror_s(buffer, sizeof(buffer), c);
#elif defined(__GLIBC__) && !defined(__UCLIBC__)  // handle glibc's weird strerror_r()
    char *s = detail::avoid_string_include::strerror_r(c, buffer, sizeof(buffer));  // NOLINT
    if(s != nullptr)
    {
      strncpy(buffer, s, sizeof(buffer) - 1);  // NOLINT
      buffer[1023] = 0;
    }
#elif !defined(__APPLE__)
    detail::avoid_string_include::strerror_r(c, buffer, sizeof(buffer));
#else
    strerror_r(c, buffer, sizeof(buffer));
#endif
    size_t length = strlen(buffer);                     // NOLINT
    auto *p = static_cast<char *>(malloc(length + 1));  // NOLINT
    if(p == nullptr)
    {
      return _base::string_ref("failed to get message from system");
    }
    memcpy(p, buffer, length + 1);  // NOLINT
    return _base::atomic_refcounted_string_ref(p, length);
  }